

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O3

string * __thiscall
pbrt::MediumHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,MediumHandle *this)

{
  ulong uVar1;
  CuboidMedium<pbrt::UniformGridMediumProvider> *this_00;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          ).bits;
  this_00 = (CuboidMedium<pbrt::UniformGridMediumProvider> *)(uVar1 & 0xffffffffffff);
  if (this_00 == (CuboidMedium<pbrt::UniformGridMediumProvider> *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(nullptr)","")
    ;
  }
  else if ((ushort)(uVar1 >> 0x30) < 3) {
    if ((uVar1 & 0x3000000000000) == 0x2000000000000) {
      CuboidMedium<pbrt::UniformGridMediumProvider>::ToString_abi_cxx11_
                (__return_storage_ptr__,this_00);
    }
    else {
      HomogeneousMedium::ToString_abi_cxx11_(__return_storage_ptr__,(HomogeneousMedium *)this_00);
    }
  }
  else if ((uVar1 & 0xfffe000000000000) == 0x2000000000000) {
    CuboidMedium<pbrt::CloudMediumProvider>::ToString_abi_cxx11_
              (__return_storage_ptr__,(CuboidMedium<pbrt::CloudMediumProvider> *)this_00);
  }
  else {
    CuboidMedium<pbrt::NanoVDBMediumProvider>::ToString_abi_cxx11_
              (__return_storage_ptr__,(CuboidMedium<pbrt::NanoVDBMediumProvider> *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MediumHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}